

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

optional<bool> __thiscall
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  atomic<unsigned_long> *paVar2;
  long lVar3;
  olc_impl_helpers oVar4;
  undefined8 uVar5;
  write_guard ptr_;
  bool bVar6;
  ushort uVar7;
  optimistic_lock *poVar8;
  undefined7 in_register_00000011;
  ushort uVar9;
  db_type *db_instance_00;
  art_key_type k_00;
  write_guard local_68;
  write_guard node_guard_1;
  write_guard child_guard_1;
  __atomic_base<unsigned_long> local_50;
  write_guard node_guard;
  write_guard local_38;
  write_guard child_guard;
  
  k_00.field_0._1_7_ = in_register_00000011;
  k_00.field_0.key_bytes._M_elems[0] = key_byte;
  db_instance_00 = k.field_0._8_8_;
  oVar4 = this[((ulong)inode & 0xffffffff) + 0x21];
  if (oVar4 == (olc_impl_helpers)0xff) {
    poVar8 = (optimistic_lock *)
             (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>.
             _M_i;
    if ((poVar8->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_00193018:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    if ((db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i !=
        *(__int_type_conflict *)&(poVar8->version).version) goto LAB_00192f07;
    LOCK();
    paVar1 = &poVar8->read_lock_count;
    lVar3 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_00193037:
      __assert_fail("old_value > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
    }
    (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
    poVar8 = parent_critical_section->lock;
    if ((poVar8->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00193018;
    if ((parent_critical_section->version).version ==
        (poVar8->version).version.super___atomic_base<unsigned_long>._M_i) {
      LOCK();
      paVar1 = &poVar8->read_lock_count;
      lVar3 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_00193037;
      parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_00192eea:
      uVar9 = 0x100;
      uVar7 = 0;
      goto LAB_00192ef0;
    }
LAB_00192ff8:
    optimistic_lock::dec_read_lock_count(poVar8);
    parent_critical_section->lock = (optimistic_lock *)0x0;
  }
  else {
    *(undefined8 *)child_type = *(undefined8 *)(this + (ulong)(byte)oVar4 * 8 + 0x140);
    bVar6 = optimistic_lock::read_critical_section::check(parent_critical_section);
    if (bVar6) {
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffffb0);
      *child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           local_50._M_i;
      local_50._M_i = 0;
      child_in_parent[1] =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffffb0);
      if (*child_in_parent !=
          (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0
         ) {
        uVar5 = *(undefined8 *)child_type;
        *(byte *)&child_critical_section->lock = (byte)uVar5 & 7;
        if ((uVar5 & (I256|I48)) == LEAF) {
          k_00.field_0.key._M_extent._M_extent_value =
               (__extent_storage<18446744073709551615UL>)
               (__extent_storage<18446744073709551615UL>)k.field_0._0_8_;
          bVar6 = basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                  ::matches((basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                             *)(uVar5 & 0xfffffffffffffff8),k_00);
          if (bVar6) {
            if (this[0x20] == (olc_impl_helpers)0x11) {
              basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              ::
              make_db_inode_unique_ptr<unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&>
                        ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                          *)&stack0xffffffffffffffb0,db_instance_00,
                         (olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                          *)this);
              local_38.lock =
                   optimistic_lock::write_guard::try_lock_upgrade
                             ((read_critical_section *)db_instance);
              if (local_38.lock != (optimistic_lock *)0x0) {
                local_68.lock =
                     optimistic_lock::write_guard::try_lock_upgrade(parent_critical_section);
                if (local_68.lock != (optimistic_lock *)0x0) {
                  node_guard_1.lock =
                       optimistic_lock::write_guard::try_lock_upgrade
                                 ((read_critical_section *)child_in_parent);
                  if (node_guard_1.lock != (optimistic_lock *)0x0) {
                    olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                    ::init((olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                            *)node_guard.lock,(EVP_PKEY_CTX *)db_instance_00);
                    ptr_ = node_guard;
                    node_guard.lock = (optimistic_lock *)0x0;
                    poVar8 = (optimistic_lock *)
                             basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(ptr_.lock,I16);
                    node_critical_section->lock = poVar8;
                    if (local_68.lock != (optimistic_lock *)0x0) {
                      __assert_fail("!node_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x644,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>]"
                                   );
                    }
                    if (node_guard_1.lock != (optimistic_lock *)0x0) {
                      __assert_fail("!child_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x645,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>]"
                                   );
                    }
                    (node_in_parent->value)._M_i.tagged_ptr = 0;
                    optimistic_lock::write_guard::~write_guard(&node_guard_1);
                    optimistic_lock::write_guard::~write_guard(&local_68);
                    optimistic_lock::write_guard::~write_guard(&local_38);
                    std::
                    unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                   *)&stack0xffffffffffffffb0);
                    LOCK();
                    paVar2 = (db_instance_00->shrinking_inode_counts)._M_elems + 2;
                    (paVar2->super___atomic_base<unsigned_long>)._M_i =
                         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
                    UNLOCK();
                    goto LAB_00192d22;
                  }
                  optimistic_lock::write_guard::~write_guard(&node_guard_1);
                }
                optimistic_lock::write_guard::~write_guard(&local_68);
              }
              optimistic_lock::write_guard::~write_guard(&local_38);
              std::
              unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             *)&stack0xffffffffffffffb0);
              goto LAB_00193001;
            }
            poVar8 = (optimistic_lock *)
                     (db_instance->root_pointer_lock).version.version.
                     super___atomic_base<unsigned_long>._M_i;
            if ((poVar8->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00193018;
            if ((db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i ==
                *(__int_type_conflict *)&(poVar8->version).version) {
              LOCK();
              paVar1 = &poVar8->read_lock_count;
              lVar3 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_00193037;
              (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>.
              _M_i = 0;
              local_50._M_i =
                   (__int_type_conflict)
                   optimistic_lock::write_guard::try_lock_upgrade(parent_critical_section);
              if ((optimistic_lock *)local_50._M_i == (optimistic_lock *)0x0) {
                uVar9 = 0;
              }
              else {
                local_38.lock =
                     optimistic_lock::write_guard::try_lock_upgrade
                               ((read_critical_section *)child_in_parent);
                if (local_38.lock == (optimistic_lock *)0x0) {
                  uVar9 = 0;
                  local_38.lock = (optimistic_lock *)0x0;
                }
                else {
                  optimistic_lock::write_unlock_and_obsolete(local_38.lock);
                  local_38.lock = (optimistic_lock *)0x0;
                  olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  ::remove((olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                            *)this,(char *)((ulong)inode & 0xff));
                  (node_in_parent->value)._M_i.tagged_ptr = 0;
                  uVar9 = 0x100;
                }
                optimistic_lock::write_guard::~write_guard(&local_38);
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffb0);
              goto LAB_00192e4c;
            }
          }
          else {
            poVar8 = (optimistic_lock *)
                     (db_instance->root_pointer_lock).version.version.
                     super___atomic_base<unsigned_long>._M_i;
            if ((poVar8->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00193018;
            if ((db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i ==
                *(__int_type_conflict *)&(poVar8->version).version) {
              LOCK();
              paVar1 = &poVar8->read_lock_count;
              lVar3 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_00193037;
              (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>.
              _M_i = 0;
              poVar8 = parent_critical_section->lock;
              if ((poVar8->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00193018;
              if ((parent_critical_section->version).version ==
                  (poVar8->version).version.super___atomic_base<unsigned_long>._M_i) {
                LOCK();
                paVar1 = &poVar8->read_lock_count;
                lVar3 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_00193037;
                parent_critical_section->lock = (optimistic_lock *)0x0;
                poVar8 = (optimistic_lock *)*child_in_parent;
                if ((poVar8->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00193018;
                parent_critical_section = (read_critical_section *)child_in_parent;
                if (child_in_parent[1] ==
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)(poVar8->version).version.super___atomic_base<unsigned_long>._M_i) {
                  LOCK();
                  paVar1 = &poVar8->read_lock_count;
                  lVar3 = (paVar1->super___atomic_base<long>)._M_i;
                  (paVar1->super___atomic_base<long>)._M_i =
                       (paVar1->super___atomic_base<long>)._M_i + -1;
                  UNLOCK();
                  if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                  goto LAB_00193037;
                  *child_in_parent =
                       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)0x0;
                  goto LAB_00192eea;
                }
              }
              goto LAB_00192ff8;
            }
          }
        }
        else {
          (node_in_parent->value)._M_i.tagged_ptr =
               (uintptr_t)(this + (ulong)(byte)oVar4 * 8 + 0x140);
          poVar8 = (optimistic_lock *)
                   (db_instance->root_pointer_lock).version.version.
                   super___atomic_base<unsigned_long>._M_i;
          if ((poVar8->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00193018;
          if ((db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i ==
              *(__int_type_conflict *)&(poVar8->version).version) {
            LOCK();
            paVar1 = &poVar8->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_00193037;
            (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i
                 = 0;
LAB_00192d22:
            uVar9 = 0x100;
LAB_00192e4c:
            uVar7 = 1;
            goto LAB_00192ef0;
          }
        }
LAB_00192f07:
        optimistic_lock::dec_read_lock_count(poVar8);
        (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0
        ;
      }
    }
  }
LAB_00193001:
  uVar7 = 0;
  uVar9 = 0;
LAB_00192ef0:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar9 | uVar7);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}